

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_text.cpp
# Opt level: O2

char * __thiscall
flatbuffers::JsonPrinter::
PrintContainer<flatbuffers::Array<flatbuffers::Offset64<void>,(unsigned_short)65535>,unsigned_short>
          (JsonPrinter *this,Array<flatbuffers::Offset64<void>,_(unsigned_short)65535> *param_2,
          ushort param_3,Type *param_4,int param_5,uint8_t *param_6)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  Array<flatbuffers::Offset64<void>,_(unsigned_short)65535> *val;
  char cVar4;
  
  uVar3 = 0;
  cVar4 = '\0';
  if (param_4->base_type == BASE_TYPE_STRUCT) {
    cVar4 = param_4->struct_def->fixed;
  }
  iVar2 = this->opts->indent_step;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  std::__cxx11::string::push_back((char)this->text);
  AddNewLine(this);
  do {
    if (param_3 == uVar3) {
      AddNewLine(this);
      AddIndent(this,param_5);
      std::__cxx11::string::push_back((char)this->text);
      return (char *)0x0;
    }
    if (uVar3 != 0) {
      AddComma(this);
      AddNewLine(this);
    }
    AddIndent(this,iVar2 + param_5);
    if (cVar4 == '\0') {
      val = (Array<flatbuffers::Offset64<void>,_(unsigned_short)65535> *)
            Array<flatbuffers::Offset64<void>,_(unsigned_short)65535>::operator[]
                      (param_2,(uoffset_t)uVar3);
    }
    else {
      val = param_2 + param_4->struct_def->bytesize * uVar3;
    }
    pcVar1 = PrintOffset(this,val,param_4,iVar2 + param_5,param_6,(uoffset_t)uVar3);
    uVar3 = uVar3 + 1;
  } while (pcVar1 == (char *)0x0);
  return pcVar1;
}

Assistant:

const char *PrintContainer(PrintPointerTag, const Container &c, SizeT size,
                             const Type &type, int indent,
                             const uint8_t *prev_val) {
    const auto is_struct = IsStruct(type);
    const auto elem_indent = indent + Indent();
    text += '[';
    AddNewLine();
    for (SizeT i = 0; i < size; i++) {
      if (i) {
        AddComma();
        AddNewLine();
      }
      AddIndent(elem_indent);
      auto ptr = is_struct ? reinterpret_cast<const void *>(
                                 c.Data() + type.struct_def->bytesize * i)
                           : c[i];
      auto err = PrintOffset(ptr, type, elem_indent, prev_val,
                             static_cast<soffset_t>(i));
      if (err) return err;
    }
    AddNewLine();
    AddIndent(indent);
    text += ']';
    return nullptr;
  }